

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O2

int __thiscall
smf::MidiFile::extractMidiData
          (MidiFile *this,istream *input,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *array,uchar *runningCommand)

{
  pointer puVar1;
  uchar uVar2;
  uchar uVar3;
  uint uVar4;
  long in_RAX;
  ostream *poVar5;
  ulong uVar6;
  ulong uVar7;
  uchar b;
  int iVar8;
  ulong uVar9;
  char *pcVar10;
  uchar d;
  byte bVar11;
  undefined3 uStack_38;
  uchar byte;
  uchar byte2;
  uchar local_33;
  uchar byte3;
  uchar byte4;
  
  puVar1 = (array->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((array->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (array->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  _uStack_38 = in_RAX;
  uVar4 = std::istream::get();
  if (uVar4 == 0xffffffff) {
    pcVar10 = "Error: unexpected end of file.";
LAB_0011854c:
    poVar5 = std::operator<<((ostream *)&std::cerr,pcVar10);
LAB_00118551:
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  else {
    uVar3 = (uchar)uVar4;
    _uStack_38 = CONCAT13(uVar3,uStack_38);
    if (-1 < (char)uVar3) {
      if (*runningCommand == 0) {
        pcVar10 = "Error: running command with no previous command";
        goto LAB_0011854c;
      }
      if (*runningCommand < 0xf0) goto LAB_00118492;
      poVar5 = std::operator<<((ostream *)&std::cerr,
                               "Error: running status not permitted with meta and sysex");
      poVar5 = std::operator<<(poVar5," event.");
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)&std::cerr,"Byte is 0x");
      *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
           *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar4 & 0x7f);
      *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
           *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
      goto LAB_00118551;
    }
    *runningCommand = uVar3;
LAB_00118492:
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(array,runningCommand);
    if (-1 < (char)uVar3) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(array,&byte);
    }
    bVar11 = *runningCommand;
    uVar4 = bVar11 - 0x80 >> 4;
    if (7 < uVar4) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Error reading midifile");
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)&std::cout,"Command byte was ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(uint)*runningCommand);
      goto LAB_00118551;
    }
    if ((0x4fU >> (uVar4 & 0x1f) & 1) == 0) {
      if ((0x30U >> (uVar4 & 0x1f) & 1) != 0) {
LAB_00118507:
        bVar11 = 1;
        if (-1 < (char)uVar3) goto LAB_0011855c;
        uVar3 = readByte(this,input);
        _uStack_38 = CONCAT13(uVar3,uStack_38);
        bVar11 = this->m_rwstatus;
        if ((bool)bVar11 != true) goto LAB_0011855c;
        if (-1 < (char)uVar3) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(array,&byte);
          goto LAB_001186f6;
        }
        goto LAB_0011856f;
      }
      if ((bVar11 == 0xf0) || (bVar11 == 0xf7)) {
        uVar7 = readVLValue(this,input);
        uVar6 = 0;
        if (0 < (int)uVar7) {
          uVar6 = uVar7 & 0xffffffff;
        }
        while (iVar8 = (int)uVar6, uVar6 = (ulong)(iVar8 - 1), iVar8 != 0) {
          uVar3 = readByte(this,input);
          _uStack_38 = CONCAT13(uVar3,uStack_38);
          bVar11 = this->m_rwstatus;
          if ((bool)bVar11 != true) goto LAB_0011855c;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(array,&byte);
        }
LAB_001186f6:
        bVar11 = 1;
        goto LAB_0011855c;
      }
      if (bVar11 != 0xff) goto LAB_001186f6;
      if ((char)uVar3 < '\0') {
        uVar3 = readByte(this,input);
        _uStack_38 = CONCAT13(uVar3,uStack_38);
        bVar11 = this->m_rwstatus;
        if ((bool)bVar11 != true) goto LAB_0011855c;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(array,&byte);
      }
      _uStack_38 = (uint5)_uStack_38;
      _uStack_38 = (uint7)_uStack_38 & 0xffffffffffff;
      _uStack_38 = (ulong)_uStack_38;
      uVar3 = readByte(this,input);
      _uStack_38 = CONCAT15(uVar3,_uStack_38);
      bVar11 = this->m_rwstatus;
      if ((bool)bVar11 != true) goto LAB_0011855c;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (array,&stack0xffffffffffffffcd);
      uVar6 = (ulong)(char)local_33;
      if (-1 < (long)uVar6) {
LAB_00118632:
        uVar9 = 0;
        if (0 < (int)uVar6) {
          uVar9 = uVar6 & 0xffffffff;
        }
        while (iVar8 = (int)uVar9, uVar9 = (ulong)(iVar8 - 1), iVar8 != 0) {
          uVar3 = readByte(this,input);
          _uStack_38 = CONCAT13(uVar3,uStack_38);
          bVar11 = this->m_rwstatus;
          if ((bool)bVar11 != true) goto LAB_0011855c;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(array,&byte);
        }
        goto LAB_001186f6;
      }
      uVar3 = readByte(this,input);
      _uStack_38 = CONCAT14(uVar3,_uStack_38);
      bVar11 = this->m_rwstatus;
      if ((bool)bVar11 != true) goto LAB_0011855c;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(array,&byte2);
      if (byte2 < 0x81) {
        uVar3 = '\0';
LAB_0011878d:
        uVar2 = local_33;
        b = byte2;
        d = '\0';
LAB_00118790:
        bVar11 = 0;
        uVar6 = unpackVLV(this,uVar2,b,uVar3,d,'\0');
        if (this->m_rwstatus == false) goto LAB_0011855c;
        goto LAB_00118632;
      }
      uVar3 = readByte(this,input);
      _uStack_38 = CONCAT16(uVar3,_uStack_38);
      bVar11 = this->m_rwstatus;
      if ((bool)bVar11 != true) goto LAB_0011855c;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(array,&byte3);
      if (-1 < (char)byte3) {
        uVar3 = byte3;
        goto LAB_0011878d;
      }
      uVar3 = readByte(this,input);
      _uStack_38 = CONCAT17(uVar3,_uStack_38);
      bVar11 = this->m_rwstatus;
      if ((bool)bVar11 != true) goto LAB_0011855c;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(array,&byte4);
      if (-1 < (long)_uStack_38) {
        uVar2 = local_33;
        b = byte2;
        uVar3 = byte3;
        d = byte4;
        goto LAB_00118790;
      }
      poVar5 = std::operator<<((ostream *)&std::cerr,"Error: cannot handle large VLVs");
    }
    else {
      uVar2 = readByte(this,input);
      _uStack_38 = CONCAT13(uVar2,uStack_38);
      bVar11 = this->m_rwstatus;
      if ((bool)bVar11 != true) goto LAB_0011855c;
      if (-1 < (char)uVar2) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(array,&byte);
        goto LAB_00118507;
      }
LAB_0011856f:
      poVar5 = std::operator<<((ostream *)&std::cerr,"MIDI data byte too large: ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(uint)byte);
    }
    std::endl<char,std::char_traits<char>>(poVar5);
    this->m_rwstatus = false;
  }
  bVar11 = 0;
LAB_0011855c:
  return (int)bVar11;
}

Assistant:

int MidiFile::extractMidiData(std::istream& input, std::vector<uchar>& array,
	uchar& runningCommand) {

	int character;
	uchar byte;
	array.clear();
	int runningQ;

	character = input.get();
	if (character == EOF) {
		std::cerr << "Error: unexpected end of file." << std::endl;
		return 0;
	} else {
		byte = (uchar)character;
	}

	if (byte < 0x80) {
		runningQ = 1;
		if (runningCommand == 0) {
			std::cerr << "Error: running command with no previous command" << std::endl;
			return 0;
		}
		if (runningCommand >= 0xf0) {
			std::cerr << "Error: running status not permitted with meta and sysex"
			     << " event." << std::endl;
			std::cerr << "Byte is 0x" << std::hex << (int)byte << std::dec << std::endl;
			return 0;
		}
	} else {
		runningCommand = byte;
		runningQ = 0;
	}

	array.push_back(runningCommand);
	if (runningQ) {
		array.push_back(byte);
	}

	switch (runningCommand & 0xf0) {
		case 0x80:        // note off (2 more bytes)
		case 0x90:        // note on (2 more bytes)
		case 0xA0:        // aftertouch (2 more bytes)
		case 0xB0:        // cont. controller (2 more bytes)
		case 0xE0:        // pitch wheel (2 more bytes)
			byte = readByte(input);
			if (!status()) { return m_rwstatus; }
			if (byte > 0x7f) {
				std::cerr << "MIDI data byte too large: " << (int)byte << std::endl;
				m_rwstatus = false; return m_rwstatus;
			}
			array.push_back(byte);
			if (!runningQ) {
				byte = readByte(input);
				if (!status()) { return m_rwstatus; }
				if (byte > 0x7f) {
					std::cerr << "MIDI data byte too large: " << (int)byte << std::endl;
					m_rwstatus = false; return m_rwstatus;
				}
				array.push_back(byte);
			}
			break;
		case 0xC0:        // patch change (1 more byte)
		case 0xD0:        // channel pressure (1 more byte)
			if (!runningQ) {
				byte = readByte(input);
				if (!status()) { return m_rwstatus; }
				if (byte > 0x7f) {
					std::cerr << "MIDI data byte too large: " << (int)byte << std::endl;
					m_rwstatus = false; return m_rwstatus;
				}
				array.push_back(byte);
			}
			break;
		case 0xF0:
			switch (runningCommand) {
				case 0xff:                 // meta event
					{
					if (!runningQ) {
						byte = readByte(input); // meta type
						if (!status()) { return m_rwstatus; }
						array.push_back(byte);
					}
					ulong length = 0;
					uchar byte1 = 0;
					uchar byte2 = 0;
					uchar byte3 = 0;
					uchar byte4 = 0;
					byte1 = readByte(input);
					if (!status()) { return m_rwstatus; }
					array.push_back(byte1);
					if (byte1 >= 0x80) {
						byte2 = readByte(input);
						if (!status()) { return m_rwstatus; }
						array.push_back(byte2);
						if (byte2 > 0x80) {
							byte3 = readByte(input);
							if (!status()) { return m_rwstatus; }
							array.push_back(byte3);
							if (byte3 >= 0x80) {
								byte4 = readByte(input);
								if (!status()) { return m_rwstatus; }
								array.push_back(byte4);
								if (byte4 >= 0x80) {
									std::cerr << "Error: cannot handle large VLVs" << std::endl;
									m_rwstatus = false; return m_rwstatus;
								} else {
									length = unpackVLV(byte1, byte2, byte3, byte4);
									if (!m_rwstatus) { return m_rwstatus; }
								}
							} else {
								length = unpackVLV(byte1, byte2, byte3);
								if (!m_rwstatus) { return m_rwstatus; }
							}
						} else {
							length = unpackVLV(byte1, byte2);
							if (!m_rwstatus) { return m_rwstatus; }
						}
					} else {
						length = byte1;
					}
					for (int j=0; j<(int)length; j++) {
						byte = readByte(input); // meta type
						if (!status()) { return m_rwstatus; }
						array.push_back(byte);
					}
					}
					break;

				// The 0xf0 and 0xf7 meta commands deal with system-exclusive
				// messages. 0xf0 is used to either start a message or to store
				// a complete message.  The 0xf0 is part of the outgoing MIDI
				// bytes.  The 0xf7 message is used to send arbitrary bytes,
				// typically the middle or ends of system exclusive messages.  The
				// 0xf7 byte at the start of the message is not part of the
				// outgoing raw MIDI bytes, but is kept in the MidiFile message
				// to indicate a raw MIDI byte message (typically a partial
				// system exclusive message).
				case 0xf7:   // Raw bytes. 0xf7 is not part of the raw
				             // bytes, but are included to indicate
				             // that this is a raw byte message.
				case 0xf0:   // System Exclusive message
					{         // (complete, or start of message).
					int length = (int)readVLValue(input);
					for (int i=0; i<length; i++) {
						byte = readByte(input);
						if (!status()) { return m_rwstatus; }
						array.push_back(byte);
					}
					}
					break;

				// other "F" MIDI commands are not expected, but can be
				// handled here if they exist.
			}
			break;
		default:
			std::cout << "Error reading midifile" << std::endl;
			std::cout << "Command byte was " << (int)runningCommand << std::endl;
			return 0;
	}
	return 1;
}